

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler.cc
# Opt level: O0

void __thiscall ProfileHandler::Reset(ProfileHandler *this)

{
  unsigned_long *this_00;
  bool bVar1;
  reference ppPVar2;
  ProfileHandlerToken *token;
  iterator __end1;
  iterator __begin1;
  CallbackList *__range1;
  SpinLockHolder sl;
  undefined1 local_b0 [8];
  ScopedSignalBlocker block;
  CallbackList copy;
  SpinLockHolder cl;
  ProfileHandler *this_local;
  
  SpinLockHolder::SpinLockHolder
            ((SpinLockHolder *)
             &copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>.
              _M_impl._M_node._M_size,&this->control_lock_);
  std::__cxx11::list<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>::list
            ((list<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_> *)
             (block.sig_set_.__val + 0xf));
  ScopedSignalBlocker::ScopedSignalBlocker((ScopedSignalBlocker *)local_b0,this->signal_number_);
  SpinLockHolder::SpinLockHolder((SpinLockHolder *)&__range1,&this->signal_lock_);
  std::swap<ProfileHandlerToken*,std::allocator<ProfileHandlerToken*>>
            ((list<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_> *)
             (block.sig_set_.__val + 0xf),&this->callbacks_);
  SpinLockHolder::~SpinLockHolder((SpinLockHolder *)&__range1);
  ScopedSignalBlocker::~ScopedSignalBlocker((ScopedSignalBlocker *)local_b0);
  this_00 = block.sig_set_.__val + 0xf;
  __end1 = std::__cxx11::list<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>::begin
                     ((list<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_> *)this_00
                     );
  token = (ProfileHandlerToken *)
          std::__cxx11::list<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>::end
                    ((list<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_> *)this_00)
  ;
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&token);
    if (!bVar1) break;
    ppPVar2 = std::_List_iterator<ProfileHandlerToken_*>::operator*(&__end1);
    if (*ppPVar2 != (ProfileHandlerToken *)0x0) {
      operator_delete(*ppPVar2,0x10);
    }
    std::_List_iterator<ProfileHandlerToken_*>::operator++(&__end1);
  }
  this->callback_count_ = 0;
  UpdateTimer(this,false);
  std::__cxx11::list<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>::~list
            ((list<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_> *)
             (block.sig_set_.__val + 0xf));
  SpinLockHolder::~SpinLockHolder
            ((SpinLockHolder *)
             &copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>.
              _M_impl._M_node._M_size);
  return;
}

Assistant:

void ProfileHandler::Reset() {
  SpinLockHolder cl(&control_lock_);
  CallbackList copy;
  {
    ScopedSignalBlocker block(signal_number_);
    SpinLockHolder sl(&signal_lock_);
    // Only do swap under this critical lock.
    using std::swap;
    swap(copy, callbacks_);
  }
  for (ProfileHandlerToken* token : copy) {
    delete token;
  }
  callback_count_ = 0;
  UpdateTimer(false);
  // copy gets deleted here
}